

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioStream.c
# Opt level: O2

UINT8 AudioDrv_DataForward_Remove(void *drvStruct,void *destDrvStruct)

{
  ADRV_LIST *__ptr;
  ADRV_LIST **ppAVar1;
  UINT8 UVar2;
  ADRV_LIST *lastLstItm;
  ADRV_LIST *local_20;
  
  if (destDrvStruct == (void *)0x0) {
    UVar2 = 0xff;
  }
  else {
    OSMutex_Lock(*(OS_MUTEX **)((long)drvStruct + 0x40));
    __ptr = ADrvLst_FindItem(*(ADRV_LIST **)((long)drvStruct + 0x38),(ADRV_INSTANCE *)destDrvStruct,
                             &local_20);
    if (__ptr == (ADRV_LIST *)0x0) {
      UVar2 = 0xff;
    }
    else {
      ppAVar1 = &local_20->next;
      if (local_20 == (ADRV_LIST *)0x0) {
        ppAVar1 = (ADRV_LIST **)((long)drvStruct + 0x38);
      }
      *ppAVar1 = __ptr->next;
      free(__ptr);
      if ((*(ADRV_LIST **)((long)drvStruct + 0x38) == (ADRV_LIST *)0x0) &&
         (*(long *)((long)drvStruct + 8) != 0)) {
        (**(code **)(*(long *)((long)drvStruct + 8) + 0x68))
                  (*(undefined8 *)((long)drvStruct + 0x20),*(undefined8 *)((long)drvStruct + 0x30),
                   *(undefined8 *)((long)drvStruct + 0x28));
      }
      UVar2 = '\0';
    }
    OSMutex_Unlock(*(OS_MUTEX **)((long)drvStruct + 0x40));
  }
  return UVar2;
}

Assistant:

UINT8 AudioDrv_DataForward_Remove(void* drvStruct, const void* destDrvStruct)
{
	ADRV_INSTANCE* audInstSrc = (ADRV_INSTANCE*)drvStruct;
	ADRV_INSTANCE* audInstDst = (ADRV_INSTANCE*)destDrvStruct;
	UINT8 retVal;
	
	if (audInstDst == NULL)
		return 0xFF;
	OSMutex_Lock(audInstSrc->hMutex);
	retVal = ADrvLst_Remove(&audInstSrc->forwardDrvs, audInstDst);
	if (retVal)
	{
		OSMutex_Unlock(audInstSrc->hMutex);
		return retVal;
	}
	
	// make it call the original callback function
	if (audInstSrc->forwardDrvs == NULL && audInstSrc->drvStruct != NULL)
		audInstSrc->drvStruct->SetCallback(audInstSrc->drvData, audInstSrc->mainCallback, audInstSrc->userParam);
	OSMutex_Unlock(audInstSrc->hMutex);
	return AERR_OK;
}